

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  int j_1;
  ulong uVar14;
  int j;
  ulong uVar15;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  Mat local_78;
  
  iVar3 = bottom_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    uVar18 = bottom_blob->c;
    Mat::create(top_blob,iVar3,iVar4,uVar18,4,opt->blob_allocator);
    uVar7 = 0xffffffffffffff9c;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar17 = iVar4 * iVar3;
      if (this->bias_data_size == 0) {
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
          Mat::channel(&local_78,bottom_blob,uVar17);
          pvVar16 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,top_blob,uVar17);
          pvVar12 = local_78.data;
          Mat::~Mat(&local_78);
          uVar8 = (ulong)uVar17;
          if (this->scale_data_size == 1) {
            uVar8 = 0;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar8 * 4);
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar12 + uVar8 * 4) =
                 (float)*(int *)((long)pvVar16 + uVar8 * 4) * fVar1;
          }
        }
      }
      else {
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
          Mat::channel(&local_78,bottom_blob,uVar17);
          pvVar16 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,top_blob,uVar17);
          pvVar12 = local_78.data;
          Mat::~Mat(&local_78);
          uVar8 = (ulong)uVar17;
          if (this->scale_data_size == 1) {
            uVar8 = 0;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar8 * 4);
          uVar8 = (ulong)uVar17;
          if (this->bias_data_size == 1) {
            uVar8 = 0;
          }
          fVar2 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar12 + uVar8 * 4) =
                 (float)*(int *)((long)pvVar16 + uVar8 * 4) * fVar1 + fVar2;
          }
        }
      }
      uVar7 = 0;
    }
  }
  else if (iVar3 == 2) {
    uVar18 = bottom_blob->w;
    uVar17 = bottom_blob->h;
    Mat::create(top_blob,uVar18,uVar17,4,opt->blob_allocator);
    pvVar16 = top_blob->data;
    uVar7 = 0xffffffffffffff9c;
    if ((pvVar16 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar3 = this->scale_data_size;
      iVar4 = this->bias_data_size;
      pvVar12 = bottom_blob->data;
      lVar10 = (long)bottom_blob->w * bottom_blob->elemsize;
      lVar13 = (long)top_blob->w * top_blob->elemsize;
      uVar8 = 0;
      uVar7 = 0;
      if (iVar4 == 0) {
        uVar9 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar9 = uVar8;
        }
        uVar11 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar11 = uVar8;
        }
        for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
          uVar15 = uVar14 & 0xffffffff;
          if (iVar3 == 1) {
            uVar15 = uVar8;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar15 * 4);
          for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pvVar16 + uVar15 * 4) =
                 (float)*(int *)((long)pvVar12 + uVar15 * 4) * fVar1;
          }
          pvVar16 = (void *)((long)pvVar16 + lVar13);
          pvVar12 = (void *)((long)pvVar12 + lVar10);
        }
      }
      else {
        uVar9 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar9 = uVar8;
        }
        uVar11 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar11 = uVar8;
        }
        for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
          uVar15 = uVar14 & 0xffffffff;
          if (iVar3 == 1) {
            uVar15 = uVar8;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar15 * 4);
          uVar15 = uVar14 & 0xffffffff;
          if (iVar4 == 1) {
            uVar15 = uVar8;
          }
          fVar2 = *(float *)((long)(this->bias_data).data + uVar15 * 4);
          for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pvVar16 + uVar15 * 4) =
                 (float)*(int *)((long)pvVar12 + uVar15 * 4) * fVar1 + fVar2;
          }
          pvVar16 = (void *)((long)pvVar16 + lVar13);
          pvVar12 = (void *)((long)pvVar12 + lVar10);
        }
      }
    }
  }
  else {
    uVar7 = 0;
    if (iVar3 == 1) {
      uVar18 = bottom_blob->w;
      Mat::create(top_blob,uVar18,4,opt->blob_allocator);
      pvVar16 = top_blob->data;
      uVar7 = 0xffffffffffffff9c;
      if ((pvVar16 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        pvVar12 = bottom_blob->data;
        if (this->scale_data_size == 1) {
          fVar1 = *(this->scale_data).data;
          if (this->bias_data_size == 1) {
            fVar2 = *(this->bias_data).data;
            uVar7 = 0;
            uVar8 = (ulong)uVar18;
            if ((int)uVar18 < 1) {
              uVar8 = 0;
            }
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar16 + uVar9 * 4) =
                   (float)*(int *)((long)pvVar12 + uVar9 * 4) * fVar1 + fVar2;
            }
          }
          else if (this->bias_data_size == 0) {
            uVar7 = 0;
            uVar8 = (ulong)uVar18;
            if ((int)uVar18 < 1) {
              uVar8 = 0;
            }
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar16 + uVar9 * 4) =
                   (float)*(int *)((long)pvVar12 + uVar9 * 4) * fVar1;
            }
          }
          else {
            pvVar5 = (this->bias_data).data;
            uVar7 = 0;
            uVar8 = (ulong)uVar18;
            if ((int)uVar18 < 1) {
              uVar8 = uVar7;
            }
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar16 + uVar9 * 4) =
                   (float)*(int *)((long)pvVar12 + uVar9 * 4) * fVar1 +
                   *(float *)((long)pvVar5 + uVar9 * 4);
            }
          }
        }
        else if (this->bias_data_size == 1) {
          pvVar5 = (this->scale_data).data;
          fVar1 = *(this->bias_data).data;
          uVar7 = 0;
          uVar8 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar16 + uVar9 * 4) =
                 (float)*(int *)((long)pvVar12 + uVar9 * 4) * *(float *)((long)pvVar5 + uVar9 * 4) +
                 fVar1;
          }
        }
        else if (this->bias_data_size == 0) {
          pvVar5 = (this->scale_data).data;
          uVar7 = 0;
          uVar8 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar16 + uVar9 * 4) =
                 (float)*(int *)((long)pvVar12 + uVar9 * 4) * *(float *)((long)pvVar5 + uVar9 * 4);
          }
        }
        else {
          pvVar5 = (this->scale_data).data;
          pvVar6 = (this->bias_data).data;
          uVar7 = 0;
          uVar8 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar16 + uVar9 * 4) =
                 (float)*(int *)((long)pvVar12 + uVar9 * 4) * *(float *)((long)pvVar5 + uVar9 * 4) +
                 *(float *)((long)pvVar6 + uVar9 * 4);
          }
        }
      }
    }
  }
  return (int)uVar7;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}